

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_Blake2s_Simd128.c
# Opt level: O3

void Hacl_Hash_Blake2s_Simd128_finish
               (uint32_t nn,uint8_t *output,Lib_IntVector_Intrinsics_vec128 *hash)

{
  longlong local_28;
  longlong lStack_20;
  longlong local_18;
  longlong lStack_10;
  
  local_28 = (*hash)[0];
  lStack_20 = (*hash)[1];
  local_18 = hash[1][0];
  lStack_10 = hash[1][1];
  memcpy(output,&local_28,(ulong)nn);
  Lib_Memzero0_memzero0(&local_28,0x20);
  return;
}

Assistant:

void
Hacl_Hash_Blake2s_Simd128_finish(
  uint32_t nn,
  uint8_t *output,
  Lib_IntVector_Intrinsics_vec128 *hash
)
{
  uint8_t b[32U] = { 0U };
  uint8_t *first = b;
  uint8_t *second = b + 16U;
  Lib_IntVector_Intrinsics_vec128 *row0 = hash;
  Lib_IntVector_Intrinsics_vec128 *row1 = hash + 1U;
  Lib_IntVector_Intrinsics_vec128_store32_le(first, row0[0U]);
  Lib_IntVector_Intrinsics_vec128_store32_le(second, row1[0U]);
  uint8_t *final = b;
  memcpy(output, final, nn * sizeof (uint8_t));
  Lib_Memzero0_memzero(b, 32U, uint8_t, void *);
}